

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred.c
# Opt level: O3

void aom_highbd_smooth_v_predictor_16x32_c
               (uint16_t *dst,ptrdiff_t stride,uint16_t *above,uint16_t *left,int bd)

{
  byte bVar1;
  ushort uVar2;
  long lVar3;
  int c;
  long lVar4;
  
  uVar2 = left[0x1f];
  lVar3 = 0;
  do {
    bVar1 = smooth_weights[lVar3 + 0x1c];
    lVar4 = 0;
    do {
      dst[lVar4] = (uint16_t)
                   ((uint)above[lVar4] * (uint)bVar1 + (uint)(byte)-bVar1 * (uint)uVar2 + 0x80 >> 8)
      ;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x10);
    lVar3 = lVar3 + 1;
    dst = dst + stride;
  } while (lVar3 != 0x20);
  return;
}

Assistant:

static inline void highbd_smooth_v_predictor(uint16_t *dst, ptrdiff_t stride,
                                             int bw, int bh,
                                             const uint16_t *above,
                                             const uint16_t *left, int bd) {
  (void)bd;
  const uint16_t below_pred = left[bh - 1];  // estimated by bottom-left pixel
  const uint8_t *const sm_weights = smooth_weights + bh - 4;
  // scale = 2^SMOOTH_WEIGHT_LOG2_SCALE
  const int log2_scale = SMOOTH_WEIGHT_LOG2_SCALE;
  const uint16_t scale = (1 << SMOOTH_WEIGHT_LOG2_SCALE);
  sm_weights_sanity_checks(sm_weights, sm_weights, scale,
                           log2_scale + sizeof(*dst));

  int r;
  for (r = 0; r < bh; r++) {
    int c;
    for (c = 0; c < bw; ++c) {
      const uint16_t pixels[] = { above[c], below_pred };
      const uint8_t weights[] = { sm_weights[r], scale - sm_weights[r] };
      uint32_t this_pred = 0;
      assert(scale >= sm_weights[r]);
      int i;
      for (i = 0; i < 2; ++i) {
        this_pred += weights[i] * pixels[i];
      }
      dst[c] = divide_round(this_pred, log2_scale);
    }
    dst += stride;
  }
}